

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

void __thiscall happly::TypedProperty<short>::~TypedProperty(TypedProperty<short> *this)

{
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__TypedProperty_0047b090;
  geometrycentral::surface::std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&(this->data).super__Vector_base<short,_std::allocator<short>_>);
  Property::~Property(&this->super_Property);
  return;
}

Assistant:

virtual ~TypedProperty() override{}